

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_unittest.pb.cc
# Opt level: O3

void __thiscall proto2_unittest::TestArenaMap::Clear(TestArenaMap *this)

{
  google::protobuf::internal::MapFieldBase::Clear((MapFieldBase *)&(this->field_0)._impl_);
  google::protobuf::internal::MapFieldBase::Clear
            ((MapFieldBase *)&(this->field_0)._impl_.map_int64_int64_);
  google::protobuf::internal::MapFieldBase::Clear
            ((MapFieldBase *)&(this->field_0)._impl_.map_uint32_uint32_);
  google::protobuf::internal::MapFieldBase::Clear
            ((MapFieldBase *)&(this->field_0)._impl_.map_uint64_uint64_);
  google::protobuf::internal::MapFieldBase::Clear
            ((MapFieldBase *)&(this->field_0)._impl_.map_sint32_sint32_);
  google::protobuf::internal::MapFieldBase::Clear
            ((MapFieldBase *)&(this->field_0)._impl_.map_sint64_sint64_);
  google::protobuf::internal::MapFieldBase::Clear
            ((MapFieldBase *)&(this->field_0)._impl_.map_fixed32_fixed32_);
  google::protobuf::internal::MapFieldBase::Clear
            ((MapFieldBase *)&(this->field_0)._impl_.map_fixed64_fixed64_);
  google::protobuf::internal::MapFieldBase::Clear
            ((MapFieldBase *)&(this->field_0)._impl_.map_sfixed32_sfixed32_);
  google::protobuf::internal::MapFieldBase::Clear
            ((MapFieldBase *)&(this->field_0)._impl_.map_sfixed64_sfixed64_);
  google::protobuf::internal::MapFieldBase::Clear
            ((MapFieldBase *)&(this->field_0)._impl_.map_int32_float_);
  google::protobuf::internal::MapFieldBase::Clear
            ((MapFieldBase *)&(this->field_0)._impl_.map_int32_double_);
  google::protobuf::internal::MapFieldBase::Clear
            ((MapFieldBase *)&(this->field_0)._impl_.map_bool_bool_);
  google::protobuf::internal::MapFieldBase::Clear
            ((MapFieldBase *)&(this->field_0)._impl_.map_string_string_);
  google::protobuf::internal::MapFieldBase::Clear
            ((MapFieldBase *)&(this->field_0)._impl_.map_int32_bytes_);
  google::protobuf::internal::MapFieldBase::Clear
            ((MapFieldBase *)&(this->field_0)._impl_.map_int32_enum_);
  google::protobuf::internal::MapFieldBase::Clear
            ((MapFieldBase *)&(this->field_0)._impl_.map_int32_foreign_message_);
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestArenaMap::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestArenaMap)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.map_int32_int32_.Clear();
  _impl_.map_int64_int64_.Clear();
  _impl_.map_uint32_uint32_.Clear();
  _impl_.map_uint64_uint64_.Clear();
  _impl_.map_sint32_sint32_.Clear();
  _impl_.map_sint64_sint64_.Clear();
  _impl_.map_fixed32_fixed32_.Clear();
  _impl_.map_fixed64_fixed64_.Clear();
  _impl_.map_sfixed32_sfixed32_.Clear();
  _impl_.map_sfixed64_sfixed64_.Clear();
  _impl_.map_int32_float_.Clear();
  _impl_.map_int32_double_.Clear();
  _impl_.map_bool_bool_.Clear();
  _impl_.map_string_string_.Clear();
  _impl_.map_int32_bytes_.Clear();
  _impl_.map_int32_enum_.Clear();
  _impl_.map_int32_foreign_message_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}